

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinSerializer<std::forward_list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>,_void>
     ::serialize<OutputStream>
               (forward_list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *s,
               OutputStream *ostream)

{
  _Fwd_list_node_base *p_Var1;
  undefined1 local_14 [4];
  
  for (p_Var1 = (s->
                super__Fwd_list_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                )._M_impl._M_head._M_next; p_Var1 != (_Fwd_list_node_base *)0x0;
      p_Var1 = p_Var1->_M_next) {
  }
  std::ostream::write((char *)(ostream->stream + 0x10),(long)local_14);
  while (s = (forward_list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)
             ((_Fwd_list_node_base *)s)->_M_next, (_Fwd_list_impl)s != (_Fwd_list_impl)0x0) {
    BuiltinSerializer<std::tuple<char,int>,void>::serialize_elems<OutputStream,0ul,1ul>
              ((long)s + 8,ostream);
  }
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }